

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_wav.h
# Opt level: O2

drwav_uint64 drwav_read_s16__ieee(drwav *pWav,drwav_uint64 samplesToRead,drwav_int16 *pBufferOut)

{
  drwav_uint64 sampleCount;
  ulong samplesToRead_00;
  drwav_uint64 dVar1;
  uchar sampleData [4096];
  double adStack_1038 [513];
  
  dVar1 = 0;
  while( true ) {
    if (samplesToRead == 0) {
      return dVar1;
    }
    samplesToRead_00 = (ulong)(0x1000 / pWav->bytesPerSample);
    if (samplesToRead < samplesToRead_00) {
      samplesToRead_00 = samplesToRead;
    }
    sampleCount = drwav_read(pWav,samplesToRead_00,adStack_1038);
    if (sampleCount == 0) break;
    if (pWav->bytesPerSample == 8) {
      drwav_f64_to_s16(pBufferOut,adStack_1038,sampleCount);
    }
    else if (pWav->bytesPerSample == 4) {
      drwav_f32_to_s16(pBufferOut,(float *)adStack_1038,sampleCount);
    }
    else {
      memset(pBufferOut,0,sampleCount * 2);
    }
    pBufferOut = pBufferOut + sampleCount;
    samplesToRead = samplesToRead - sampleCount;
    dVar1 = dVar1 + sampleCount;
  }
  return dVar1;
}

Assistant:

drwav_uint64 drwav_read_s16__ieee(drwav* pWav, drwav_uint64 samplesToRead, drwav_int16* pBufferOut) {
    drwav_uint64 totalSamplesRead = 0;
    unsigned char sampleData[4096];
    while (samplesToRead > 0) {
        drwav_uint64 samplesRead =
            drwav_read(pWav, drwav_min(samplesToRead, sizeof(sampleData) / pWav->bytesPerSample), sampleData);
        if (samplesRead == 0) {
            break;
        }

        drwav__ieee_to_s16(pBufferOut, sampleData, (size_t)samplesRead, pWav->bytesPerSample);

        pBufferOut += samplesRead;
        samplesToRead -= samplesRead;
        totalSamplesRead += samplesRead;
    }

    return totalSamplesRead;
}